

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_device_changed_callback.cpp
# Opt level: O0

void device_changed_callback(void *user)

{
  bool bVar1;
  AssertHelper *this;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  AssertionResult *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar_;
  char (*in_stack_ffffffffffffff98) [63];
  AssertionResult *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_18;
  
  fprintf(_stderr,"device changed callback\n");
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_ffffffffffffffa0,(bool *)in_stack_ffffffffffffff98,(type *)0x10ba19);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    this = (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
    testing::internal::AssertHelper::operator=(in_stack_00000020,(Message *)in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper(this);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    testing::Message::~Message((Message *)0x10bac3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10badf);
  return;
}

Assistant:

void
device_changed_callback(void * user)
{
  fprintf(stderr, "device changed callback\n");
  ASSERT_TRUE(false) << "Error: device changed callback"
                        " called without changing devices";
}